

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  function<void_()> *this;
  char **in_RSI;
  int in_EDI;
  exception *e;
  service srv;
  submitter local_60;
  submitter local_58 [4];
  undefined1 local_38 [32];
  service local_18 [20];
  undefined4 local_4;
  
  local_4 = 0;
  cppcms::service::service(local_18,in_EDI,in_RSI);
  this = (function<void_()> *)cppcms::service::applications_pool();
  cppcms::create_pool<unit_test>();
  cppcms::applications_pool::mount(this,local_38,0);
  std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x110c00);
  submitter::submitter(&local_60,local_18);
  std::function<void()>::function<submitter,void>(this,local_58);
  cppcms::service::after_fork((function *)local_18);
  std::function<void_()>::~function((function<void_()> *)0x110c40);
  cppcms::service::run();
  cppcms::service::~service(local_18);
  return (uint)((run_ok & 1U) == 0);
}

Assistant:

int main(int argc,char **argv)
{
	try {
		cppcms::service srv(argc,argv);
		srv.applications_pool().mount( cppcms::create_pool<unit_test>());
		srv.after_fork(submitter(srv));
		srv.run();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	return run_ok ? EXIT_SUCCESS : EXIT_FAILURE;
}